

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void pnga_norm_infinity(Integer g_a,double *nm)

{
  int iVar1;
  Integer icode;
  Integer IVar2;
  Integer icode_00;
  Integer IVar3;
  int iVar4;
  long lVar5;
  double *pdVar6;
  char *pcVar7;
  double *pdVar8;
  long lVar9;
  long lVar10;
  double *pdVar11;
  double *pdVar12;
  float fVar13;
  double *pdVar14;
  long lVar15;
  double dVar16;
  double *pdVar17;
  long lVar18;
  double *pdVar19;
  double *pdVar20;
  bool bVar21;
  uint uVar22;
  ulong uVar23;
  float fVar24;
  double dVar25;
  float fVar26;
  double dVar27;
  float fsum;
  int isum;
  double *local_3e8;
  long local_3e0;
  double local_3d8;
  Integer type;
  float local_3c8 [2];
  double dsum;
  long lsum;
  char *ptr;
  double *local_3a8;
  float fval;
  undefined4 uStack_39c;
  Integer ld;
  Integer ndim;
  Integer hi [2];
  Integer lo [2];
  Integer dims [7];
  _iterator_hdl hdl;
  
  local_3e8 = nm;
  pnga_nodeid();
  pnga_nnodes();
  iVar1 = _ga_sync_end;
  isum = 0;
  lsum = 0;
  dsum = 0.0;
  fsum = 0.0;
  ptr = (char *)0x0;
  local_3d8 = 0.0;
  local_3c8[0] = 0.0;
  _ga_sync_end = 1;
  bVar21 = _ga_sync_begin != 0;
  _ga_sync_begin = _ga_sync_end;
  if (bVar21) {
    pnga_sync();
  }
  pnga_check_handle(g_a,"ga_norm_infinity_");
  pnga_inquire(g_a,&type,&ndim,dims);
  if (ndim - 3U < 0xfffffffffffffffe) {
    pnga_error("ga_norm_infinity: wrong dimension",ndim);
  }
  switch(type) {
  case 0x3e9:
    local_3a8 = (double *)&isum;
    break;
  case 0x3ea:
    local_3a8 = (double *)&lsum;
    break;
  case 0x3eb:
    local_3a8 = (double *)&fsum;
    break;
  case 0x3ec:
    local_3a8 = &dsum;
    break;
  default:
    pnga_error("ga_norm_infinity_: wrong data type:",type);
    local_3a8 = (double *)0x0;
    break;
  case 0x3ee:
    local_3a8 = (double *)local_3c8;
    break;
  case 0x3ef:
    local_3a8 = &local_3d8;
  }
  pnga_local_iterator_init(g_a,&hdl);
  pdVar19 = local_3a8;
  while (iVar4 = pnga_local_iterator_next(&hdl,lo,hi,&ptr,&ld), icode_00 = ndim, IVar2 = ld,
        pdVar20 = (double *)ptr, icode = type, iVar4 != 0) {
    lVar5 = type + -0x3e9;
    switch(lVar5) {
    case 0:
      pdVar6 = pdVar19;
      break;
    case 1:
      pdVar6 = (double *)0x0;
      pdVar11 = pdVar19;
      goto LAB_00125c85;
    case 2:
      pdVar6 = (double *)0x0;
      pdVar11 = (double *)0x0;
      pdVar8 = (double *)0x0;
      pdVar14 = pdVar19;
      goto LAB_00125c93;
    case 3:
      pdVar6 = (double *)0x0;
      pdVar11 = (double *)0x0;
      pdVar8 = pdVar19;
      goto LAB_00125c90;
    default:
      pnga_error("ga_norm_infinity_: wrong data type:",type);
      pdVar6 = (double *)0x0;
      break;
    case 5:
      pdVar6 = (double *)0x0;
      pdVar11 = (double *)0x0;
      pdVar8 = (double *)0x0;
      pdVar14 = (double *)0x0;
      pdVar12 = (double *)0x0;
      pdVar17 = pdVar19;
      goto LAB_00125c98;
    case 6:
      pdVar6 = (double *)0x0;
      pdVar11 = (double *)0x0;
      pdVar8 = (double *)0x0;
      pdVar14 = (double *)0x0;
      pdVar12 = pdVar19;
      goto LAB_00125c95;
    }
    pdVar11 = (double *)0x0;
LAB_00125c85:
    pdVar8 = (double *)0x0;
LAB_00125c90:
    pdVar14 = (double *)0x0;
LAB_00125c93:
    pdVar12 = (double *)0x0;
LAB_00125c95:
    pdVar17 = (double *)0x0;
LAB_00125c98:
    IVar3 = hi[0];
    if (icode_00 < 1) {
LAB_00125cb8:
      pnga_error("ga_norm_infinity: wrong dimension",icode_00);
    }
    else {
      if (icode_00 == 1) {
        lVar10 = 1;
        lVar18 = 1;
      }
      else {
        lVar10 = hi[1];
        lVar18 = lo[1];
        if (icode_00 != 2) goto LAB_00125cb8;
      }
      pdVar19 = local_3a8;
      if (0 < lVar10 && 0 < hi[0]) {
        local_3e0 = lo[0];
        switch(lVar5) {
        case 0:
          fVar24 = *(float *)pdVar20;
          fVar26 = (float)-(int)fVar24;
          if (0 < (int)fVar24) {
            fVar26 = fVar24;
          }
          *(float *)pdVar6 = fVar26;
          lVar5 = IVar3 - local_3e0;
          for (lVar9 = 0; lVar9 <= lVar10 - lVar18; lVar9 = lVar9 + 1) {
            for (lVar15 = 0; lVar15 <= lVar5; lVar15 = lVar15 + 1) {
              fVar24 = *(float *)((long)pdVar20 + lVar15 * 4);
              fVar13 = (float)-(int)fVar24;
              if (0 < (int)fVar24) {
                fVar13 = fVar24;
              }
              if ((int)fVar26 < (int)fVar13) {
                *(float *)pdVar6 = fVar13;
                fVar26 = fVar13;
              }
            }
            pdVar20 = (double *)((long)pdVar20 + IVar2 * 4);
          }
          break;
        case 1:
          dVar25 = *pdVar20;
          dVar27 = (double)-(long)dVar25;
          if (0 < (long)dVar25) {
            dVar27 = dVar25;
          }
          *pdVar11 = dVar27;
          lVar5 = IVar3 - local_3e0;
          for (lVar9 = 0; lVar9 <= lVar10 - lVar18; lVar9 = lVar9 + 1) {
            for (lVar15 = 0; lVar15 <= lVar5; lVar15 = lVar15 + 1) {
              dVar25 = *(double *)((long)pdVar20 + lVar15 * 8);
              dVar16 = (double)-(long)dVar25;
              if (0 < (long)dVar25) {
                dVar16 = dVar25;
              }
              if ((long)dVar27 < (long)dVar16) {
                *pdVar11 = dVar16;
                dVar27 = dVar16;
              }
            }
            pdVar20 = (double *)((long)pdVar20 + IVar2 * 8);
          }
          break;
        case 2:
          fVar24 = *(float *)pdVar20;
          *(float *)pdVar14 = fVar24;
          lVar5 = IVar3 - local_3e0;
          for (lVar9 = 0; lVar9 <= lVar10 - lVar18; lVar9 = lVar9 + 1) {
            for (lVar15 = 0; lVar15 <= lVar5; lVar15 = lVar15 + 1) {
              fVar26 = *(float *)((long)pdVar20 + lVar15 * 4);
              uVar22 = -(uint)(fVar26 < -fVar26);
              fVar26 = (float)(~uVar22 & (uint)fVar26 | (uint)-fVar26 & uVar22);
              if (fVar24 < fVar26) {
                *(float *)pdVar14 = fVar26;
                fVar24 = fVar26;
              }
            }
            pdVar20 = (double *)((long)pdVar20 + IVar2 * 4);
          }
          break;
        case 3:
          dVar25 = *pdVar20;
          *pdVar8 = dVar25;
          lVar5 = IVar3 - local_3e0;
          for (lVar9 = 0; lVar9 <= lVar5; lVar9 = lVar9 + 1) {
            pdVar6 = pdVar20;
            for (lVar15 = 0; lVar15 <= lVar10 - lVar18; lVar15 = lVar15 + 1) {
              dVar27 = *pdVar6;
              dVar16 = (double)((ulong)dVar27 ^ (ulong)DAT_001aa7d0);
              uVar23 = -(ulong)(dVar27 < dVar16);
              dVar27 = (double)(~uVar23 & (ulong)dVar27 | (ulong)dVar16 & uVar23);
              if (dVar25 < dVar27) {
                *pdVar8 = dVar27;
                dVar25 = dVar27;
              }
              pdVar6 = pdVar6 + IVar2;
            }
            pdVar20 = pdVar20 + 1;
          }
          break;
        default:
          pnga_error("sgai_norm_infinity_block: wrong data type ",icode);
          break;
        case 5:
          pcVar7 = (char *)((long)pdVar20 + 4);
          fVar24 = SQRT(*(float *)pdVar20 * *(float *)pdVar20 +
                        *(float *)((long)pdVar20 + 4) * *(float *)((long)pdVar20 + 4));
          *(float *)pdVar17 = fVar24;
          lVar5 = IVar3 - local_3e0;
          for (lVar9 = 0; lVar9 <= lVar10 - lVar18; lVar9 = lVar9 + 1) {
            for (lVar15 = 0; lVar15 <= lVar5; lVar15 = lVar15 + 1) {
              fVar26 = SQRT(*(float *)(pcVar7 + lVar15 * 8 + -4) *
                            *(float *)(pcVar7 + lVar15 * 8 + -4) +
                            *(float *)(pcVar7 + lVar15 * 8) * *(float *)(pcVar7 + lVar15 * 8));
              if (fVar24 < fVar26) {
                *(float *)pdVar17 = fVar26;
                fVar24 = fVar26;
              }
            }
            pcVar7 = pcVar7 + IVar2 * 8;
          }
          break;
        case 6:
          pdVar6 = (double *)((long)pdVar20 + 8);
          dVar25 = SQRT(*pdVar20 * *pdVar20 +
                        *(double *)((long)pdVar20 + 8) * *(double *)((long)pdVar20 + 8));
          *pdVar12 = dVar25;
          lVar5 = IVar3 - local_3e0;
          for (lVar9 = 0; lVar9 <= lVar10 - lVar18; lVar9 = lVar9 + 1) {
            pdVar20 = pdVar6;
            for (lVar15 = 0; lVar15 <= lVar5; lVar15 = lVar15 + 1) {
              dVar27 = SQRT(pdVar20[-1] * pdVar20[-1] + *pdVar20 * *pdVar20);
              if (dVar25 < dVar27) {
                *pdVar12 = dVar27;
                dVar25 = dVar27;
              }
              pdVar20 = pdVar20 + 2;
            }
            pdVar6 = pdVar6 + IVar2 * 2;
          }
        }
      }
    }
  }
  switch(type) {
  case 0x3e9:
    armci_msg_igop(&isum,1,"max");
    break;
  case 0x3ea:
    armci_msg_lgop(&lsum,1,"max");
    break;
  case 0x3eb:
    armci_msg_fgop(&fsum,1,"max");
    break;
  case 0x3ec:
    armci_msg_dgop(&dsum,1,"max");
    break;
  default:
    pnga_error("ga_norm_infinity_: wrong data type ",type);
    break;
  case 0x3ee:
    _fval = (double)CONCAT44(uStack_39c,local_3c8[0]);
    armci_msg_fgop(&fval,1,"max");
    local_3c8[0] = fval;
    break;
  case 0x3ef:
    _fval = local_3d8;
    armci_msg_dgop((double *)&fval,1,"max");
    local_3d8 = _fval;
  }
  switch(type) {
  case 0x3e9:
    dVar25 = (double)isum;
    break;
  case 0x3ea:
    dVar25 = (double)lsum;
    break;
  case 0x3eb:
    dVar25 = (double)fsum;
    break;
  case 0x3ec:
    dVar25 = dsum;
    break;
  default:
    pnga_error("ga_norm_infinity_:wrong data type.",type);
    goto LAB_0012610c;
  case 0x3ee:
    dVar25 = (double)local_3c8[0];
    break;
  case 0x3ef:
    dVar25 = local_3d8;
  }
  *local_3e8 = dVar25;
LAB_0012610c:
  if (iVar1 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_norm_infinity(Integer g_a, double *nm)
{
  Integer type;
  Integer me = pnga_nodeid (), i, j, nproc = pnga_nnodes();
  Integer ndim, dims[MAXDIM], lo[2], hi[2], ld;
  Integer num_blocks_a;
  int local_sync_begin,local_sync_end;
  int isum = 0;
  long lsum = 0;
  double dsum = 0.0;
  float fsum = 0.0;
  float fval;
  double dval;
  DoubleComplex zsum;
  SingleComplex csum;
  char *buf = NULL;
  char *ptr = NULL;
  zsum.real = 0.0;
  zsum.imag = 0.0;
  csum.real = 0.0;
  csum.imag = 0.0;
  _iterator_hdl hdl;


  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();

  pnga_check_handle (g_a, "ga_norm_infinity_");

  pnga_inquire (g_a, &type, &ndim, dims);

  if(ndim<=0)
    pnga_error("ga_norm_infinity: wrong dimension", ndim);
  else if (ndim >= 3)
    pnga_error("ga_norm_infinity: wrong dimension", ndim);


  switch (type)
  {
    case C_INT:
      buf = (void*)(&isum);
      break;
    case C_LONG:
      buf = (void*)(&lsum);
      break;
    case C_FLOAT:
      buf = (void*)(&fsum);
      break;
    case C_DBL:
      buf = (void*)(&dsum);
      break;
    case C_DCPL:
      buf = (void*)(&zsum);
      break;
    case C_SCPL:
      buf = (void*)(&csum);
      break;
    default:
      pnga_error("ga_norm_infinity_: wrong data type:", type);
  }

#if 1
  pnga_local_iterator_init(g_a, &hdl);
  while (pnga_local_iterator_next(&hdl,lo,hi,&ptr,&ld)) {
    sgai_norm_infinity_block(g_a, ptr, lo, hi, ld, type, ndim, dims, buf);
  }
#else
  num_blocks_a = pnga_total_blocks(g_a);

  if (num_blocks_a < 0) {
    pnga_distribution(g_a, me, lo, hi);
    pnga_access_ptr(g_a, lo, hi, &ptr, &ld);
    sgai_norm_infinity_block(g_a, ptr, lo, hi, ld, type, ndim, dims, buf);
    pnga_release_update(g_a, lo, hi);
  } else {
    Integer idx;
    /* Simple block-cyclic data distribution */
    if (!pnga_uses_proc_grid(g_a)) {
      for (idx = me; idx < num_blocks_a; idx += nproc) {
        pnga_distribution(g_a, idx, lo, hi);
        pnga_access_block_ptr(g_a, idx, &ptr, &ld);
        sgai_norm_infinity_block(g_a, ptr, lo, hi, ld, type, ndim, dims, buf);
        pnga_release_update_block(g_a, idx);
      }
    } else {
      /* Uses scalapack block-cyclic data distribution */
      Integer chk;
      Integer proc_index[MAXDIM], index[MAXDIM];
      Integer topology[MAXDIM];
      Integer blocks[MAXDIM], block_dims[MAXDIM];
      pnga_get_proc_index(g_a, me, proc_index);
      pnga_get_proc_index(g_a, me, index);
      pnga_get_block_info(g_a, blocks, block_dims);
      pnga_get_proc_grid(g_a, topology);
      while (index[ndim-1] < blocks[ndim-1]) {
        /* find bounding coordinates of block */
        chk = 1;
        for (i = 0; i < ndim; i++) {
          lo[i] = index[i]*block_dims[i]+1;
          hi[i] = (index[i] + 1)*block_dims[i];
          if (hi[i] > dims[i]) hi[i] = dims[i];
          if (hi[i] < lo[i]) chk = 0;
        }
        if (chk) {
          pnga_access_block_grid_ptr(g_a, index, &ptr, &ld);
          sgai_norm_infinity_block(g_a, ptr, lo, hi, ld, type, ndim, dims, buf);
          pnga_release_update_block_grid(g_a, index);
        }
        /* increment index to get next block on processor */
        index[0] += topology[0];
        for (i = 0; i < ndim; i++) {
          if (index[i] >= blocks[i] && i<ndim-1) {
            index[i] = proc_index[i];
            index[i+1] += topology[i+1];
          }
        }
      }
    }
  }
#endif


  /*calculate the global value buf[j] for each column */
  switch (type)
  {
    case C_INT:
      armci_msg_igop (&isum, 1, "max");
      break;
    case C_DBL:
      armci_msg_dgop (&dsum, 1, "max");
      break;
    case C_DCPL:
      dval = zsum.real;
      armci_msg_dgop (&dval, 1, "max");
      zsum.real = dval;
      break;
    case C_FLOAT:
      armci_msg_fgop (&fsum, 1, "max");
      break;
    case C_SCPL:
      fval = csum.real;
      armci_msg_fgop (&fval, 1, "max");
      csum.real = fval;
      break;
    case C_LONG:
      armci_msg_lgop (&lsum, 1, "max");
      break;
    default:
      pnga_error("ga_norm_infinity_: wrong data type ", type);
  }

  /*evaluate the norm infinity for the matrix g_a */
  switch (type)
  {
    case C_INT:
      *nm = (double)isum;
      break;
    case C_LONG:
      *nm = (double)lsum;
      break;
    case C_FLOAT:
      *nm = (double)fsum;
      break;
    case C_DBL:
      *nm = (double)dsum;
      break;
    case C_DCPL:
      *nm = (double)(zsum.real);
      break;
    case C_SCPL:
      *nm = (double)(csum.real);
      break;
    default:
      pnga_error("ga_norm_infinity_:wrong data type.", type);
  }

  if (local_sync_end)pnga_sync();
}